

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::destroy_pipeline
          (ConvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  size_type sVar1;
  reference ppLVar2;
  undefined8 in_RSI;
  long in_RDI;
  int i;
  int local_14;
  
  if (*(long *)(in_RDI + 0x2d0) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x2d0) + 0x28))(*(long **)(in_RDI + 0x2d0),in_RSI);
    if (*(long **)(in_RDI + 0x2d0) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x2d0) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x2d0) = 0;
  }
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x2d8));
    if ((int)sVar1 <= local_14) break;
    ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x2d8),
                         (long)local_14);
    (*(*ppLVar2)->_vptr_Layer[5])(*ppLVar2,in_RSI);
    ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x2d8),
                         (long)local_14);
    if (*ppLVar2 != (value_type)0x0) {
      (*(*ppLVar2)->_vptr_Layer[1])();
    }
    local_14 = local_14 + 1;
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x142549b);
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    for (int i = 0; i < (int)group_ops.size(); i++)
    {
        group_ops[i]->destroy_pipeline(opt);
        delete group_ops[i];
    }
    group_ops.clear();

    return 0;
}